

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O2

Vec_Int_t * Saig_TsiComputeTransient(Saig_Tsim_t *p,int nPref)

{
  int *__s;
  uint uVar1;
  Vec_Int_t *p_00;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  int i;
  uint uVar5;
  uint i_00;
  uint uVar6;
  uint local_50;
  
  uVar4 = p->pAig->nRegs;
  p_00 = Vec_IntAlloc(nPref);
  p_00->nSize = nPref;
  __s = p_00->pArray;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)nPref << 2);
  }
  uVar3 = 0;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  uVar5 = 0xffffffff;
  local_50 = 0xffffffff;
  uVar1 = 0xffffffff;
  do {
    if (uVar3 == uVar4) {
      i = 0;
      if (nPref < 1) {
        nPref = 0;
      }
      for (; nPref != i; i = i + 1) {
        Vec_IntEntry(p_00,i);
      }
      return p_00;
    }
    uVar6 = uVar3 * 2 & 0x1e;
    for (i_00 = 0; (int)i_00 < p->vStates->nSize; i_00 = i_00 + 1) {
      pvVar2 = Vec_PtrEntry(p->vStates,i_00);
      uVar1 = *(uint *)((long)pvVar2 + (ulong)(uVar3 >> 4) * 4);
      uVar1 = (uint)((uVar1 >> uVar6 & 1) != 0) | (uVar1 >> ((char)uVar6 + 1U & 0x1f)) * 2 & 2;
      if (uVar1 == 0) {
        __assert_fail("ValueThis != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigPhase.c"
                      ,0x10f,"Vec_Int_t *Saig_TsiComputeTransient(Saig_Tsim_t *, int)");
      }
      if (uVar5 != uVar1) {
        local_50 = i_00;
      }
      uVar5 = uVar1;
    }
    if ((uVar1 != 3) && ((int)local_50 < nPref)) {
      if ((int)local_50 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1da,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      __s[local_50] = __s[local_50] + 1;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Saig_TsiComputeTransient( Saig_Tsim_t * p, int nPref )
{
    Vec_Int_t * vCounters;
    unsigned * pState;
    int ValueThis = -1, ValuePrev = -1, StepPrev = -1;
    int i, k, nRegs = p->pAig->nRegs;
    vCounters = Vec_IntStart( nPref );
    for ( i = 0; i < nRegs; i++ )
    {
        Vec_PtrForEachEntry( unsigned *, p->vStates, pState, k )
        {
            ValueThis = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
//printf( "%s", (ValueThis == 1)? "0" : ((ValueThis == 2)? "1" : "x") );
            assert( ValueThis != 0 );
            if ( ValuePrev != ValueThis )
            {
                ValuePrev = ValueThis;
                StepPrev  = k;
            }
        }
//printf( "\n" );
        if ( ValueThis == SAIG_XVSX )
            continue;
        if ( StepPrev >= nPref )
            continue;
        Vec_IntAddToEntry( vCounters, StepPrev, 1 );
    }
    Vec_IntForEachEntry( vCounters, ValueThis, i )
    {
        if ( ValueThis == 0 )
            continue;
//        printf( "%3d : %3d\n", i, ValueThis );
    }
    return vCounters;
}